

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

void Service_FindServers(UA_Server *server,UA_Session *session,UA_FindServersRequest *request,
                        UA_FindServersResponse *response)

{
  size_t sVar1;
  UA_StatusCode UVar2;
  UA_ApplicationDescription *dst;
  UA_String *pUVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  
  dst = (UA_ApplicationDescription *)malloc(0x78);
  if (dst == (UA_ApplicationDescription *)0x0) {
    (response->responseHeader).serviceResult = 0x80030000;
  }
  else {
    UVar2 = UA_ApplicationDescription_copy(&(server->config).applicationDescription,dst);
    (response->responseHeader).serviceResult = UVar2;
    if (UVar2 != 0) {
      free(dst);
      return;
    }
    pUVar3 = (UA_String *)
             realloc(dst->discoveryUrls,
                     ((server->config).networkLayersSize + dst->discoveryUrlsSize) * 0x10);
    if (pUVar3 == (UA_String *)0x0) {
      (response->responseHeader).serviceResult = 0x80030000;
      UA_delete(dst,UA_TYPES + 0x8f);
      return;
    }
    sVar1 = dst->discoveryUrlsSize;
    dst->discoveryUrls = pUVar3;
    uVar4 = (server->config).networkLayersSize;
    dst->discoveryUrlsSize = uVar4 + sVar1;
    lVar6 = sVar1 << 4;
    lVar7 = 8;
    for (uVar5 = 0; uVar5 < uVar4; uVar5 = uVar5 + 1) {
      UA_String_copy((UA_String *)((long)&((server->config).networkLayers)->handle + lVar7),
                     (UA_String *)((long)&dst->discoveryUrls->length + lVar6));
      uVar4 = (server->config).networkLayersSize;
      lVar6 = lVar6 + 0x10;
      lVar7 = lVar7 + 0x38;
    }
    response->servers = dst;
    response->serversSize = 1;
  }
  return;
}

Assistant:

void Service_FindServers(UA_Server *server, UA_Session *session,
                         const UA_FindServersRequest *request, UA_FindServersResponse *response) {
    UA_LOG_DEBUG_SESSION(server->config.logger, session, "Processing FindServersRequest");
    /* copy ApplicationDescription from the config */
    UA_ApplicationDescription *descr = UA_malloc(sizeof(UA_ApplicationDescription));
    if(!descr) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADOUTOFMEMORY;
        return;
    }
    response->responseHeader.serviceResult =
        UA_ApplicationDescription_copy(&server->config.applicationDescription, descr);
    if(response->responseHeader.serviceResult != UA_STATUSCODE_GOOD) {
        UA_free(descr);
        return;
    }

    /* add the discoveryUrls from the networklayers */
    UA_String *disc = UA_realloc(descr->discoveryUrls, sizeof(UA_String) *
                                 (descr->discoveryUrlsSize + server->config.networkLayersSize));
    if(!disc) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADOUTOFMEMORY;
        UA_ApplicationDescription_delete(descr);
        return;
    }
    size_t existing = descr->discoveryUrlsSize;
    descr->discoveryUrls = disc;
    descr->discoveryUrlsSize += server->config.networkLayersSize;

    // TODO: Add nl only if discoveryUrl not already present
    for(size_t i = 0; i < server->config.networkLayersSize; ++i) {
        UA_ServerNetworkLayer *nl = &server->config.networkLayers[i];
        UA_String_copy(&nl->discoveryUrl, &descr->discoveryUrls[existing + i]);
    }

    response->servers = descr;
    response->serversSize = 1;
}